

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateIndexTypeTraits
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
          *enumData)

{
  string *psVar1;
  _Alloc_hider _Var2;
  pointer pEVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pcVar7;
  void *pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  pointer pcVar11;
  pointer pEVar12;
  pointer pEVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type sVar15;
  long lVar16;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string typeTraitsTemplate;
  string valueName;
  string typeTraitTemplate;
  string cppType;
  string typeTraits;
  allocator_type local_1f2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string *local_b0;
  pointer local_a8;
  VulkanHppGenerator *local_a0;
  string *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_b0 = __return_storage_ptr__;
  local_a0 = this;
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&enumData->first,"VkIndexType");
  if (iVar5 != 0) {
    __assert_fail("enumData.first == \"VkIndexType\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x209a,
                  "std::string VulkanHppGenerator::generateIndexTypeTraits(const std::pair<std::string, EnumData> &) const"
                 );
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  pEVar13 = (enumData->second).values.
            super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar12 = (enumData->second).values.
            super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar12;
  if (pEVar13 != pEVar12) {
    do {
      local_a8 = pEVar3;
      paVar14 = &local_1d0.first.field_2;
      local_1d0.first._M_string_length = (size_type)(pEVar13->name)._M_dataplus._M_p;
      local_1d0.first._M_dataplus._M_p = (pointer)(pEVar13->name)._M_string_length;
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_1d0,
                         "VK_INDEX_TYPE_");
      if (!bVar4) {
        __assert_fail("value.name.starts_with( \"VK_INDEX_TYPE_\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x209f,
                      "std::string VulkanHppGenerator::generateIndexTypeTraits(const std::pair<std::string, EnumData> &) const"
                     );
      }
      local_1d0.first._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"VK_INDEX_TYPE_","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      pcVar7 = (pEVar13->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar7,pcVar7 + (pEVar13->name)._M_string_length);
      sVar15 = local_1d0.first._M_string_length;
      if ((local_1d0.first._M_string_length <= local_1f0._M_string_length) &&
         (((pointer)local_1d0.first._M_string_length == (pointer)0x0 ||
          (iVar5 = bcmp(local_1f0._M_dataplus._M_p,local_1d0.first._M_dataplus._M_p,
                        local_1d0.first._M_string_length), iVar5 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_1f0,0,sVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.first._M_dataplus._M_p != paVar14) {
        operator_delete(local_1d0.first._M_dataplus._M_p,
                        local_1d0.first.field_2._M_allocated_capacity + 1);
      }
      local_1d0.first._M_dataplus._M_p = (pointer)local_1f0._M_string_length;
      local_1d0.first._M_string_length = (size_type)local_1f0._M_dataplus._M_p;
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_1d0,"NONE");
      if (!bVar4) {
        psVar1 = &pEVar13->name;
        local_1d0.first._M_dataplus._M_p = (pointer)local_1f0._M_string_length;
        local_1d0.first._M_string_length = (size_type)local_1f0._M_dataplus._M_p;
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1d0,"UINT");
        iVar5 = pEVar13->xmlLine;
        std::operator+(&local_150,"unknown VkIndexType <",psVar1);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_150,"> encountered");
        local_1d0.first._M_dataplus._M_p = (pointer)&local_1d0.first.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if (paVar14 == paVar9) {
          local_1d0.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1d0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_1d0.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1d0.first._M_dataplus._M_p = (pointer)paVar14;
        }
        local_1d0.first._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError(bVar4,iVar5,&local_1d0.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0.first._M_dataplus._M_p != &local_1d0.first.field_2) {
          operator_delete(local_1d0.first._M_dataplus._M_p,
                          local_1d0.first.field_2._M_allocated_capacity + 1);
        }
        local_98 = psVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        pcVar7 = (pointer)std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          find_first_of(&local_1f0,"0123456789",0,10);
        sVar15 = local_1f0._M_string_length;
        _Var2._M_p = local_1f0._M_dataplus._M_p;
        if (pcVar7 == (pointer)0xffffffffffffffff) {
          __assert_fail("pos != std::string::npos",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x20a6,
                        "std::string VulkanHppGenerator::generateIndexTypeTraits(const std::pair<std::string, EnumData> &) const"
                       );
        }
        pcVar10 = (pointer)0xffffffffffffffff;
        pcVar11 = pcVar7;
        if (pcVar7 < local_1f0._M_string_length) {
          do {
            pvVar8 = memchr("0123456789",(int)_Var2._M_p[(long)pcVar11],10);
            pcVar10 = pcVar11;
            if (pvVar8 == (void *)0x0) break;
            pcVar11 = pcVar11 + 1;
            pcVar10 = (pointer)0xffffffffffffffff;
          } while ((pointer)sVar15 != pcVar11);
        }
        sVar15 = (long)pcVar10 - (long)pcVar7;
        if (pcVar10 == (pointer)0xffffffffffffffff) {
          sVar15 = 0xffffffffffffffff;
        }
        local_1d0.first._M_dataplus._M_p = (pointer)&local_1d0.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"VkIndexType","");
        generateEnumValueName(&local_150,local_a0,&local_1d0.first,local_98,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0.first._M_dataplus._M_p != &local_1d0.first.field_2) {
          operator_delete(local_1d0.first._M_dataplus._M_p,
                          local_1d0.first.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_130,&local_1f0,(size_type)pcVar7,sVar15);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_130,0,0,"uint",4);
        local_1d0.first._M_dataplus._M_p = (pointer)&local_1d0.first.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if (paVar14 == paVar9) {
          local_1d0.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1d0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_1d0.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1d0.first._M_dataplus._M_p = (pointer)paVar14;
        }
        local_1d0.first._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1d0.first,"_t");
        local_110._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar14 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == paVar14) {
          local_110.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_110._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0.first._M_dataplus._M_p != &local_1d0.first.field_2) {
          operator_delete(local_1d0.first._M_dataplus._M_p,
                          local_1d0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "  template <>\n  struct IndexTypeValue<${cppType}>\n  {\n    static VULKAN_HPP_CONST_OR_CONSTEXPR IndexType value = IndexType::${valueName};\n  };\n\n  template <>\n  struct CppType<IndexType, IndexType::${valueName}>\n  {\n    using Type = ${cppType};\n  };\n"
                   ,"");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_1d0,(char (*) [8])"cppType",&local_110);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_190,(char (*) [10])"valueName",&local_150);
        __l._M_len = 2;
        __l._M_array = &local_1d0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60,__l,&local_1f1,&local_1f2);
        replaceWithMap(&local_d0,&local_130,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_60);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_f0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        lVar16 = -0x80;
        paVar14 = &local_190.second.field_2;
        do {
          if (paVar14 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar14->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar14->_M_allocated_capacity)[-2],
                            paVar14->_M_allocated_capacity + 1);
          }
          if (&paVar14->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar14->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar14->_M_allocated_capacity)[-6],
                            (&paVar14->_M_allocated_capacity)[-4] + 1);
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar14->_M_allocated_capacity + -8);
          lVar16 = lVar16 + 0x40;
        } while (lVar16 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        pEVar12 = local_a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      pEVar13 = pEVar13 + 1;
      pEVar3 = local_a8;
    } while (pEVar13 != pEVar12);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "\n  //=========================\n  //=== Index Type Traits ===\n  //=========================\n\n  template<typename T>\n  struct IndexTypeValue\n  {};\n\n${typeTraits}\n"
             ,"");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_1d0,(char (*) [11])"typeTraits",&local_f0);
  psVar1 = local_b0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_1d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_90,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_150,(allocator_type *)&local_110);
  replaceWithMap(psVar1,&local_1f0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.second._M_dataplus._M_p != &local_1d0.second.field_2) {
    operator_delete(local_1d0.second._M_dataplus._M_p,
                    local_1d0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.first._M_dataplus._M_p != &local_1d0.first.field_2) {
    operator_delete(local_1d0.first._M_dataplus._M_p,
                    local_1d0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return psVar1;
}

Assistant:

std::string VulkanHppGenerator::generateIndexTypeTraits( std::pair<std::string, EnumData> const & enumData ) const
{
  assert( enumData.first == "VkIndexType" );

  std::string typeTraits;
  for ( auto const & value : enumData.second.values )
  {
    assert( value.name.starts_with( "VK_INDEX_TYPE_" ) );
    std::string type = stripPrefix( value.name, "VK_INDEX_TYPE_" );

    if ( !type.starts_with( "NONE" ) )
    {
      checkForError( type.starts_with( "UINT" ), value.xmlLine, "unknown VkIndexType <" + value.name + "> encountered" );
      std::string::size_type pos = type.find_first_of( "0123456789" );
      assert( pos != std::string::npos );
      std::string::size_type end   = type.find_first_not_of( "0123456789", pos );
      std::string::size_type count = ( end != std::string::npos ) ? ( end - pos ) : end;

      std::string valueName = generateEnumValueName( "VkIndexType", value.name, false );
      std::string cppType   = "uint" + type.substr( pos, count ) + "_t";

      const std::string typeTraitTemplate = R"(  template <>
  struct IndexTypeValue<${cppType}>
  {
    static VULKAN_HPP_CONST_OR_CONSTEXPR IndexType value = IndexType::${valueName};
  };

  template <>
  struct CppType<IndexType, IndexType::${valueName}>
  {
    using Type = ${cppType};
  };
)";

      typeTraits += replaceWithMap( typeTraitTemplate, { { "cppType", cppType }, { "valueName", valueName } } );
    }
  }

  const std::string typeTraitsTemplate = R"(
  //=========================
  //=== Index Type Traits ===
  //=========================

  template<typename T>
  struct IndexTypeValue
  {};

${typeTraits}
)";

  return replaceWithMap( typeTraitsTemplate, { { "typeTraits", typeTraits } } );
}